

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

void frame_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  Fl_Color FVar1;
  uchar *puVar2;
  size_t sVar3;
  char *pcVar4;
  int local_40;
  int local_3c;
  int d_1;
  int d;
  size_t b;
  uchar *g;
  char *pcStack_20;
  Fl_Color bc_local;
  char *c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  puVar2 = fl_gray_ramp();
  sVar3 = strlen(c);
  _d_1 = (sVar3 >> 2) + 1;
  pcStack_20 = c;
  c_local._0_4_ = h;
  c_local._4_4_ = w;
  h_local = y;
  w_local = x;
  if (w == h) {
    for (; 1 < _d_1; _d_1 = _d_1 - 1) {
      FVar1 = shade_color(puVar2[(int)*pcStack_20],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,(int)c_local,45.0,135.0);
      FVar1 = shade_color(puVar2[(int)pcStack_20[1]],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,(int)c_local,315.0,405.0);
      pcVar4 = pcStack_20 + 3;
      FVar1 = shade_color(puVar2[(int)pcStack_20[2]],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,(int)c_local,225.0,315.0);
      pcStack_20 = pcStack_20 + 4;
      FVar1 = shade_color(puVar2[(int)*pcVar4],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,(int)c_local,135.0,225.0);
      w_local = w_local + 1;
      h_local = h_local + 1;
      c_local._4_4_ = c_local._4_4_ + -2;
      c_local._0_4_ = (int)c_local + -2;
    }
  }
  else if (h < w) {
    local_3c = h / 2;
    for (; 1 < _d_1; _d_1 = _d_1 - 1) {
      FVar1 = shade_color(puVar2[(int)*pcStack_20],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,(int)c_local,(int)c_local,90.0,135.0);
      fl_xyline(w_local + local_3c,h_local,(w_local + c_local._4_4_) - local_3c);
      fl_arc((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,45.0,90.0);
      FVar1 = shade_color(puVar2[(int)pcStack_20[1]],bc);
      fl_color(FVar1);
      fl_arc((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,315.0,405.0)
      ;
      pcVar4 = pcStack_20 + 3;
      FVar1 = shade_color(puVar2[(int)pcStack_20[2]],bc);
      fl_color(FVar1);
      fl_arc((w_local + c_local._4_4_) - (int)c_local,h_local,(int)c_local,(int)c_local,270.0,315.0)
      ;
      fl_xyline(w_local + local_3c,h_local + (int)c_local + -1,(w_local + c_local._4_4_) - local_3c)
      ;
      fl_arc(w_local,h_local,(int)c_local,(int)c_local,225.0,270.0);
      pcStack_20 = pcStack_20 + 4;
      FVar1 = shade_color(puVar2[(int)*pcVar4],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,(int)c_local,(int)c_local,135.0,225.0);
      local_3c = local_3c + -1;
      w_local = w_local + 1;
      h_local = h_local + 1;
      c_local._4_4_ = c_local._4_4_ + -2;
      c_local._0_4_ = (int)c_local + -2;
    }
  }
  else if (w < h) {
    local_40 = w / 2;
    for (; 1 < _d_1; _d_1 = _d_1 - 1) {
      FVar1 = shade_color(puVar2[(int)*pcStack_20],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,c_local._4_4_,45.0,135.0);
      FVar1 = shade_color(puVar2[(int)pcStack_20[1]],bc);
      fl_color(FVar1);
      fl_arc(w_local,h_local,c_local._4_4_,c_local._4_4_,0.0,45.0);
      fl_yxline(w_local + c_local._4_4_ + -1,h_local + local_40,(h_local + (int)c_local) - local_40)
      ;
      fl_arc(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,315.0,
             360.0);
      pcVar4 = pcStack_20 + 3;
      FVar1 = shade_color(puVar2[(int)pcStack_20[2]],bc);
      fl_color(FVar1);
      fl_arc(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,225.0,
             315.0);
      pcStack_20 = pcStack_20 + 4;
      FVar1 = shade_color(puVar2[(int)*pcVar4],bc);
      fl_color(FVar1);
      fl_arc(w_local,(h_local + (int)c_local) - c_local._4_4_,c_local._4_4_,c_local._4_4_,180.0,
             225.0);
      fl_yxline(w_local,h_local + local_40,(h_local + (int)c_local) - local_40);
      fl_arc(w_local,h_local,c_local._4_4_,c_local._4_4_,135.0,180.0);
      local_40 = local_40 + -1;
      w_local = w_local + 1;
      h_local = h_local + 1;
      c_local._4_4_ = c_local._4_4_ + -2;
      c_local._0_4_ = (int)c_local + -2;
    }
  }
  return;
}

Assistant:

static void frame_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  size_t b = strlen(c) / 4 + 1;

  if (w==h) {
    for (; b > 1; b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 135.0, 225.0);
    }
  } else if (w>h) {
    int d = h/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 90.0, 135.0);
      fl_xyline(x+d, y, x+w-d);
      fl_arc(x+w-h, y, h, h, 45.0, 90.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 270.0, 315.0);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_arc(x, y, h, h, 225.0, 270.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 135.0, 225.0);
    }
  } else if (w<h) {
    int d = w/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 0.0, 45.0);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_arc(x, y+h-w, w, w, 315.0, 360.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 180.0, 225.0);
      fl_yxline(x, y+d, y+h-d);
      fl_arc(x, y, w, w, 135.0, 180.0);
    }
  }
}